

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

void __thiscall icu_63::ZNStringPool::~ZNStringPool(ZNStringPool *this)

{
  ZNStringPoolChunk *pZVar1;
  void *in_RSI;
  ZNStringPoolChunk *this_00;
  
  if (this->fHash != (UHashtable *)0x0) {
    uhash_close_63(this->fHash);
    this->fHash = (UHashtable *)0x0;
  }
  this_00 = this->fChunks;
  while (this_00 != (ZNStringPoolChunk *)0x0) {
    pZVar1 = this_00->fNext;
    UMemory::operator_delete((UMemory *)this_00,in_RSI);
    this->fChunks = pZVar1;
    this_00 = pZVar1;
  }
  return;
}

Assistant:

ZNStringPool::~ZNStringPool() {
    if (fHash != NULL) {
        uhash_close(fHash);
        fHash = NULL;
    }

    while (fChunks != NULL) {
        ZNStringPoolChunk *nextChunk = fChunks->fNext;
        delete fChunks;
        fChunks = nextChunk;
    }
}